

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

bool __thiscall
QArrayDataPointer<QTzType>::tryReadjustFreeSpace
          (QArrayDataPointer<QTzType> *this,GrowthPosition pos,qsizetype n,QTzType **data)

{
  Data *pDVar1;
  long lVar2;
  P _b;
  long lVar3;
  long lVar4;
  long lVar5;
  
  pDVar1 = this->d;
  if (pDVar1 == (Data *)0x0) {
    lVar3 = 0;
    lVar4 = 0;
    lVar5 = 0;
  }
  else {
    lVar3 = (pDVar1->super_QArrayData).alloc;
    lVar4 = (long)((long)this->ptr -
                  ((ulong)((long)&pDVar1[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3
    ;
    lVar5 = (pDVar1->super_QArrayData).alloc -
            (((long)((long)this->ptr -
                    ((ulong)((long)&pDVar1[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >>
             3) + this->size);
  }
  if (((pos == GrowsAtEnd) && (n <= lVar4)) &&
     (lVar2 = this->size * 3, SBORROW8(lVar2,lVar3 * 2) != lVar2 + lVar3 * -2 < 0)) {
    lVar3 = 0;
  }
  else {
    if (pos != GrowsAtBeginning) {
      return false;
    }
    if (lVar5 < n) {
      return false;
    }
    if (lVar3 <= this->size * 3) {
      return false;
    }
    lVar5 = (lVar3 - (this->size + n)) / 2;
    lVar3 = 0;
    if (0 < lVar5) {
      lVar3 = lVar5;
    }
    lVar3 = lVar3 + n;
  }
  relocate(this,lVar3 - lVar4,data);
  return true;
}

Assistant:

qsizetype constAllocatedCapacity() const noexcept { return d ? d->constAllocatedCapacity() : 0; }